

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c2mir.c
# Opt level: O0

int eval_binop_operands(c2m_ctx_t c2m_ctx,node_t_conflict tree,val *v1,val *v2)

{
  node_t_conflict pnVar1;
  val vVar2;
  undefined4 uStack_44;
  undefined4 uStack_34;
  val *v2_local;
  val *v1_local;
  node_t_conflict tree_local;
  c2m_ctx_t c2m_ctx_local;
  
  pnVar1 = DLIST_node_t_head(&(tree->u).ops);
  vVar2 = eval(c2m_ctx,pnVar1);
  *(ulong *)v1 = CONCAT44(uStack_34,vVar2.uns_p);
  (v1->u).i_val = (mir_llong)vVar2.u;
  pnVar1 = DLIST_node_t_el(&(tree->u).ops,1);
  vVar2 = eval(c2m_ctx,pnVar1);
  *(ulong *)v2 = CONCAT44(uStack_44,vVar2.uns_p);
  (v2->u).i_val = (mir_llong)vVar2.u;
  if ((v1->uns_p == 0) || (v2->uns_p != 0)) {
    if ((v1->uns_p == 0) && (v2->uns_p != 0)) {
      v1->uns_p = 1;
      v1->u = v1->u;
    }
  }
  else {
    v2->uns_p = 1;
    v2->u = v2->u;
  }
  return v1->uns_p;
}

Assistant:

static int eval_binop_operands (c2m_ctx_t c2m_ctx, node_t tree, struct val *v1, struct val *v2) {
  *v1 = eval (c2m_ctx, NL_HEAD (tree->u.ops));
  *v2 = eval (c2m_ctx, NL_EL (tree->u.ops, 1));
  if (v1->uns_p && !v2->uns_p) {
    v2->uns_p = TRUE;
    v2->u.u_val = v2->u.i_val;
  } else if (!v1->uns_p && v2->uns_p) {
    v1->uns_p = TRUE;
    v1->u.u_val = v1->u.i_val;
  }
  return v1->uns_p;
}